

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_read_record(mbedtls_ssl_context *ssl)

{
  int iVar1;
  
  if (ssl->keep_current_message == 0) {
    do {
      do {
        iVar1 = mbedtls_ssl_read_record_layer(ssl);
      } while (iVar1 == -0x6580);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = mbedtls_ssl_handle_message_type(ssl);
    } while ((iVar1 == -0x6680) || (iVar1 == -0x6580));
    if ((iVar1 == 0) && (iVar1 = 0, ssl->in_msgtype == 0x16)) {
      mbedtls_ssl_update_handshake_status(ssl);
    }
  }
  else {
    ssl->keep_current_message = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_read_record( mbedtls_ssl_context *ssl )
{
    int ret;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> read record" ) );

    if( ssl->keep_current_message == 0 )
    {
        do {

            do ret = mbedtls_ssl_read_record_layer( ssl );
            while( ret == MBEDTLS_ERR_SSL_CONTINUE_PROCESSING );

            if( ret != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, ( "mbedtls_ssl_read_record_layer" ), ret );
                return( ret );
            }

            ret = mbedtls_ssl_handle_message_type( ssl );

        } while( MBEDTLS_ERR_SSL_NON_FATAL           == ret  ||
                 MBEDTLS_ERR_SSL_CONTINUE_PROCESSING == ret );

        if( 0 != ret )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "mbedtls_ssl_handle_message_type" ), ret );
            return( ret );
        }

        if( ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE )
        {
            mbedtls_ssl_update_handshake_status( ssl );
        }
    }
    else
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= reuse previously read message" ) );
        ssl->keep_current_message = 0;
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= read record" ) );

    return( 0 );
}